

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

BaseNode * __thiscall asmjit::v1_14::BaseBuilder::addNode(BaseBuilder *this,BaseNode *node)

{
  BaseNode *pBVar1;
  NodeList *pNVar2;
  NodeList *pNVar3;
  
  if (*(long *)node != 0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/builder.cpp"
               ,0x95,"!node->_prev");
  }
  if (*(long *)(node + 8) != 0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/builder.cpp"
               ,0x96,"!node->_next");
  }
  if ((char)node[0x11] < '\0') {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/builder.cpp"
               ,0x97,"!node->isActive()");
  }
  pBVar1 = this->_cursor;
  if (pBVar1 == (BaseNode *)0x0) {
    if (*(long *)&this->_nodeList == 0) {
      *(BaseNode **)&this->_nodeList = node;
      pNVar3 = (NodeList *)&this->field_0x1a8;
    }
    else {
      *(long *)(node + 8) = *(long *)&this->_nodeList;
      **(undefined8 **)&this->_nodeList = node;
      pNVar3 = &this->_nodeList;
    }
  }
  else {
    pNVar2 = *(NodeList **)(pBVar1 + 8);
    *(BaseNode **)node = pBVar1;
    *(NodeList **)(node + 8) = pNVar2;
    *(BaseNode **)(pBVar1 + 8) = node;
    pNVar3 = (NodeList *)&this->field_0x1a8;
    if (pNVar2 != (NodeList *)0x0) {
      pNVar3 = pNVar2;
    }
  }
  *(BaseNode **)pNVar3 = node;
  node[0x11] = (BaseNode)((byte)node[0x11] | 0x80);
  if (node[0x10] == (BaseNode)0x2) {
    this->_dirtySectionLinks = true;
  }
  this->_cursor = node;
  return node;
}

Assistant:

BaseNode* BaseBuilder::addNode(BaseNode* node) noexcept {
  ASMJIT_ASSERT(!node->_prev);
  ASMJIT_ASSERT(!node->_next);
  ASMJIT_ASSERT(!node->isActive());

  if (!_cursor) {
    if (_nodeList.empty()) {
      _nodeList.reset(node, node);
    }
    else {
      node->_next = _nodeList.first();
      _nodeList._first->_prev = node;
      _nodeList._first = node;
    }
  }
  else {
    BaseNode* prev = _cursor;
    BaseNode* next = _cursor->next();

    node->_prev = prev;
    node->_next = next;

    prev->_next = node;
    if (next)
      next->_prev = node;
    else
      _nodeList._last = node;
  }

  node->addFlags(NodeFlags::kIsActive);
  if (node->isSection())
    _dirtySectionLinks = true;

  _cursor = node;
  return node;
}